

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseCommandList(WastParser *this,Script *script,CommandPtrVector *commands)

{
  Result RVar1;
  TokenTypePair TVar2;
  bool bVar3;
  _Head_base<0UL,_wabt::Command_*,_false> local_38;
  
  do {
    TVar2 = PeekPair(this);
    if (TVar2._M_elems[0] != Lpar) {
      return (Result)Ok;
    }
    if (Register < TVar2._M_elems[1]) {
      return (Result)Ok;
    }
    if ((0x411203fcU >> (TVar2._M_elems[1] & Result) & 1) == 0) {
      return (Result)Ok;
    }
    local_38._M_head_impl = (Command *)0x0;
    RVar1 = ParseCommand(this,script,(CommandPtr *)&local_38);
    if (RVar1.enum_ == Ok) {
      bVar3 = true;
      std::
      vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
      ::emplace_back<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>
                ((vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
                  *)commands,
                 (unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_> *)&local_38);
    }
    else {
      RVar1 = Synchronize(this,anon_unknown_1::IsCommand);
      bVar3 = RVar1.enum_ != Error;
    }
    if (local_38._M_head_impl != (Command *)0x0) {
      (*(local_38._M_head_impl)->_vptr_Command[1])();
    }
  } while (bVar3);
  return (Result)Error;
}

Assistant:

Result WastParser::ParseCommandList(Script* script,
                                    CommandPtrVector* commands) {
  WABT_TRACE(ParseCommandList);
  while (IsCommand(PeekPair())) {
    CommandPtr command;
    if (Succeeded(ParseCommand(script, &command))) {
      commands->push_back(std::move(command));
    } else {
      CHECK_RESULT(Synchronize(IsCommand));
    }
  }
  return Result::Ok;
}